

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmNinjaTargetGenerator::CompileWithDefines(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  bool bVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  pointer local_28;
  undefined8 local_20;
  char *local_18;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_28 = (lang->_M_dataplus)._M_p;
  local_30 = lang->_M_string_length;
  local_40._M_len = 6;
  local_40._M_str = "CMAKE_";
  local_20 = 0x15;
  local_18 = "_COMPILE_WITH_DEFINES";
  views._M_len = 3;
  views._M_array = &local_40;
  cmCatViews_abi_cxx11_(&local_60,views);
  bVar1 = cmMakefile::IsOn(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmNinjaTargetGenerator::CompileWithDefines(std::string const& lang) const
{
  return this->Makefile->IsOn(
    cmStrCat("CMAKE_", lang, "_COMPILE_WITH_DEFINES"));
}